

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O1

void GenCodeCmdLequald(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  x86XmmReg reg1;
  x86XmmReg reg2;
  
  reg1 = CodeGenGenericContext::GetXmmReg(&ctx->ctx);
  EMIT_OP_REG_RPTR(&ctx->ctx,o_movsd,reg1,sQWORD,rEBX,(uint)((ulong)cmd >> 0xd) & 0x7f8);
  reg2 = GenCodeLoadDoubleFromPointerIntoRegister(ctx,rEAX,cmd.rC,cmd.argument);
  CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
            (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
  EMIT_OP_REG_REG(&ctx->ctx,o_cmplesd,reg1,reg2);
  EMIT_OP_REG_REG(&ctx->ctx,o_movd,rEAX,reg1);
  EMIT_OP_REG_NUM(&ctx->ctx,o_and,rEAX,1);
  EMIT_OP_RPTR_REG(&ctx->ctx,o_mov,sDWORD,rEBX,(uint)((ulong)cmd >> 5) & 0x7f8,rEAX);
  return;
}

Assistant:

void GenCodeCmdLequald(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
	x86XmmReg lhs = ctx.ctx.GetXmmReg();

	EMIT_OP_REG_RPTR(ctx.ctx, o_movsd, lhs, sQWORD, rREG, cmd.rB * 8); // Load double value

	x86XmmReg rhs = GenCodeLoadDoubleFromPointerIntoRegister(ctx, rRAX, cmd.rC, cmd.argument);

	ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

	EMIT_OP_REG_REG(ctx.ctx, o_cmplesd, lhs, rhs);
	EMIT_OP_REG_REG(ctx.ctx, o_movd, rEAX, lhs);
	EMIT_OP_REG_NUM(ctx.ctx, o_and, rEAX, 0x01);

	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8, rEAX); // Store int to target
}